

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemon.cpp
# Opt level: O3

void __thiscall Daemon::die_with_worker_status(Daemon *this,int status)

{
  ContextManager *pCVar1;
  char *pcVar2;
  uint __sig;
  string local_38;
  
  pCVar1 = ContextManager::get();
  __sig = status & 0x7f;
  if (__sig == 0) {
    format_abi_cxx11_(&local_38,"Worker exited with exitcode %d",(ulong)((uint)status >> 8) & 0xff);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_38);
  }
  else {
    pcVar2 = strsignal(__sig);
    format_abi_cxx11_(&local_38,"Worker was killed with signal %d (%s)",(ulong)__sig,pcVar2);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Daemon::die_with_worker_status(int status) {
    if (WIFEXITED(status)) {
        die(format("Worker exited with exitcode %d", WEXITSTATUS(status)));
    } else {
        die(format("Worker was killed with signal %d (%s)", WTERMSIG(status), strsignal(WTERMSIG(status))));
    }
}